

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,Flags flags)

{
  deUint32 *pdVar1;
  TestLog *pTVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkBuffer buffer;
  bool bVar4;
  ulong uVar5;
  deUint32 dVar6;
  bool bVar7;
  int iVar8;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format;
  ProgramBinary *pPVar9;
  GraphicsPipelineBuilder *pGVar10;
  NotSupportedError *this;
  ConstPixelBufferAccess *access;
  void *__buf;
  TestStatus *pTVar11;
  deUint32 y;
  deUint32 dVar12;
  deUint32 z;
  uint uVar13;
  int iVar14;
  VkDeviceSize bufferSize;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  ulong uStackY_730;
  IVec2 renderSize;
  IVec2 pointSize;
  string local_6e0;
  deUint32 local_6bc;
  RefBase<vk::VkCommandBuffer_s_*> local_6b8;
  TestStatus *local_698;
  ulong local_690;
  ConstPixelBufferAccess image;
  Vector<int,_2> local_650;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_648;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_628;
  Image colorAttachmentImage;
  string local_578;
  Buffer colorBuffer;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_528;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_508;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_4e8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_4c8;
  ConstPixelBufferAccess local_4a0;
  VkPhysicalDeviceProperties properties;
  GraphicsPipelineBuilder local_138;
  
  if ((flags & 8) == 0) {
    uVar13 = flags >> 3 & 2;
    if ((flags & 2) == 0) {
      if ((flags & 1) == 0) {
        uStackY_730 = 0xffffffffffffffff;
      }
      else {
        uStackY_730 = (ulong)(uVar13 + (flags >> 1 & 2) + 2);
      }
    }
    else {
      uStackY_730 = (ulong)(uVar13 | 4);
    }
  }
  else {
    uStackY_730 = 6;
  }
  local_698 = __return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x23);
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
       = (int)uStackY_730;
  ::vk::getPhysicalDeviceProperties(&properties,vki,physDevice);
  if ((int)properties.limits.pointSizeRange[1] < (int)uStackY_730) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)&colorAttachmentImage,(int *)&colorBuffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   "Test requires point size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colorAttachmentImage);
    tcu::NotSupportedError::NotSupportedError(this,(string *)&local_138);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar2 = context->m_testCtx->m_log;
  if ((flags & 1) != 0) {
    pdVar1 = &properties.vendorID;
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"Setting point size in vertex shader to 2.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  if ((flags & 2) != 0) {
    pdVar1 = &properties.vendorID;
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"Setting point size in tessellation evaluation shader to 4.0."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  if ((flags & 4) != 0) {
    pdVar1 = &properties.vendorID;
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,
                    "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  if ((flags & 8) != 0) {
    pdVar1 = &properties.vendorID;
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"Setting point size in geometry shader to 6.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  if ((flags & 0x10) != 0) {
    pdVar1 = &properties.vendorID;
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"Reading point size in geometry shader and adding 2.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  local_690 = uStackY_730;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  local_6bc = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  renderSize.m_data[0] = 0x20;
  renderSize.m_data[1] = 0x20;
  makeImageCreateInfo((VkImageCreateInfo *)&properties,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,device,allocator,(VkImageCreateInfo *)&properties,
               (MemoryRequirement)0x0);
  iVar14 = renderSize.m_data[1] * renderSize.m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar14 * iVar8);
  makeBufferCreateInfo((VkBufferCreateInfo *)&properties,bufferSize,2);
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,device,allocator,(VkBufferCreateInfo *)&properties,
             (MemoryRequirement)0x1);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_4c8.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_4c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4c8.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_4c8.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_4c8.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&properties);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&properties,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_628.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_628.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_628.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_628.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_628.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&properties);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                  (VkRenderPass)local_628.m_data.object.m_internal,
                  (VkImageView)local_4c8.m_data.object.m_internal,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  local_4e8.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_4e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4e8.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_4e8.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_4e8.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&properties);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device);
  local_508.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_508.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_508.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_508.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_508.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&properties);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&properties,vk,device,local_6bc);
  local_528.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_528.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_528.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_528.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_528.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&properties);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&properties,vk,device,
             (VkCommandPool)local_528.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_6b8.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_6b8.m_data.deleter.m_pool.m_internal._0_1_ = properties.deviceName[4];
  local_6b8.m_data.deleter.m_pool.m_internal._1_1_ = properties.deviceName[5];
  local_6b8.m_data.deleter.m_pool.m_internal._2_1_ = properties.deviceName[6];
  local_6b8.m_data.deleter.m_pool.m_internal._3_1_ = properties.deviceName[7];
  local_6b8.m_data.deleter.m_pool.m_internal._4_1_ = properties.deviceName[8];
  local_6b8.m_data.deleter.m_pool.m_internal._5_1_ = properties.deviceName[9];
  local_6b8.m_data.deleter.m_pool.m_internal._6_1_ = properties.deviceName[10];
  local_6b8.m_data.deleter.m_pool.m_internal._7_1_ = properties.deviceName[0xb];
  local_6b8.m_data.object = (VkCommandBuffer_s *)properties._0_8_;
  local_6b8.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&properties);
  memset(&local_138.m_vertexShaderModule,0,0xf4);
  local_138.m_blendEnable = false;
  local_138.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_138.m_renderSize.m_data = renderSize.m_data;
  local_138.m_patchControlPoints = 1;
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&properties,"vert",(allocator<char> *)&local_648);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&properties);
  pGVar10 = GraphicsPipelineBuilder::setShader
                      (&local_138,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar9,
                       (VkSpecializationInfo *)0x0);
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image,"frag",(allocator<char> *)&local_6e0);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&image);
  GraphicsPipelineBuilder::setShader
            (pGVar10,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar9,(VkSpecializationInfo *)0x0);
  std::__cxx11::string::~string((string *)&image);
  std::__cxx11::string::~string((string *)&properties);
  if ((flags & 6) != 0) {
    pPVar3 = context->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&properties,"tesc",(allocator<char> *)&local_648);
    pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&properties);
    pGVar10 = GraphicsPipelineBuilder::setShader
                        (&local_138,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar9,
                         (VkSpecializationInfo *)0x0);
    pPVar3 = context->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image,"tese",(allocator<char> *)&local_6e0);
    pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&image);
    GraphicsPipelineBuilder::setShader
              (pGVar10,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar9,
               (VkSpecializationInfo *)0x0);
    std::__cxx11::string::~string((string *)&image);
    std::__cxx11::string::~string((string *)&properties);
  }
  if ((flags & 0x18) != 0) {
    pPVar3 = context->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&properties,"geom",(allocator<char> *)&image);
    pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&properties);
    GraphicsPipelineBuilder::setShader
              (&local_138,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar9,(VkSpecializationInfo *)0x0)
    ;
    std::__cxx11::string::~string((string *)&properties);
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&properties,&local_138,vk,device,
             (VkPipelineLayout)local_508.m_data.object.m_internal,
             (VkRenderPass)local_628.m_data.object.m_internal);
  local_648.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_648.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_648.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_648.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_648.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&properties);
  beginCommandBuffer(vk,local_6b8.m_data.object);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_6b8.m_data.object,1,0x80,0,0,0,0,0,1,&properties);
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = renderSize.m_data[0];
  properties.deviceID = renderSize.m_data[1];
  image.m_format.order = R;
  image.m_format.type = SNORM_INT8;
  image.m_size.m_data[0] = 0;
  image.m_size.m_data[1] = 0x3f800000;
  beginRenderPass(vk,local_6b8.m_data.object,(VkRenderPass)local_628.m_data.object.m_internal,
                  (VkFramebuffer)local_4e8.m_data.object.m_internal,(VkRect2D *)&properties,
                  (Vec4 *)&image);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_6b8.m_data.object,0,local_648.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_6b8.m_data.object,1,1,0,0);
  endRenderPass(vk,local_6b8.m_data.object);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0x100,0x800,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_6b8.m_data.object,0x400,0x1000,0,0,0,0,0,1,&properties);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&properties,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_6b8.m_data.object,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             CONCAT44(colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal._4_4_,
                      (int)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data
                           .object.m_internal),1,(int)&properties);
  buffer.m_internal._4_4_ =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  buffer.m_internal._0_4_ =
       (int)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
            m_internal;
  makeBufferMemoryBarrier((VkBufferMemoryBarrier *)&properties,0x1000,0x2000,buffer,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_6b8.m_data.object,0x1000,0x4000,0,0,0,1,(int)&properties,0,0);
  endCommandBuffer(vk,local_6b8.m_data.object);
  submitCommandsAndWait(vk,device,queue,local_6b8.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  properties._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  uVar5 = local_690;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image,(TextureFormat *)&properties,renderSize.m_data[0],renderSize.m_data[1],1,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  pTVar2 = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"color0",(allocator<char> *)&pointSize);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"",(allocator<char> *)&local_650);
  access = &image;
  tcu::LogImage::LogImage
            ((LogImage *)&properties,&local_6e0,&local_578,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&properties,(int)pTVar2,__buf,(size_t)access);
  tcu::LogImage::~LogImage((LogImage *)&properties);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_6e0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_4a0,&image);
  pdVar1 = &properties.vendorID;
  properties._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::operator<<((ostream *)pdVar1,"Verifying rendered point size. Expecting ");
  std::ostream::operator<<(pdVar1,(int)uVar5);
  std::operator<<((ostream *)pdVar1," pixels.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_6e0);
  local_578._M_dataplus._M_p = (pointer)0x0;
  local_578._M_string_length = 0x3f80000000000000;
  bVar4 = false;
  dVar6 = 0;
  while (z = dVar6, (int)z < local_4a0.m_size.m_data[1]) {
    dVar6 = z + 1;
    dVar12 = 0;
    while (y = dVar12, (int)y < local_4a0.m_size.m_data[0]) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&properties,(int)&local_4a0,y,z);
      bVar7 = tcu::Vector<float,_4>::operator!=
                        ((Vector<float,_4> *)&properties,(Vector<float,_4> *)&local_578);
      if (bVar7) {
        if (bVar4) {
          if ((int)y <= (int)(deUint32)local_6e0._M_dataplus._M_p) {
            local_6e0._M_dataplus._M_p._0_4_ = y;
          }
          if ((int)z <= (int)local_6e0._M_dataplus._M_p._4_4_) {
            local_6e0._M_dataplus._M_p._4_4_ = z;
          }
          dVar12 = y + 1;
          if ((int)(deUint32)local_6e0._M_string_length <= (int)dVar12) {
            local_6e0._M_string_length._0_4_ = dVar12;
          }
          if ((int)local_6e0._M_string_length._4_4_ <= (int)dVar6) {
            local_6e0._M_string_length._4_4_ = dVar6;
          }
        }
        else {
          local_6e0._M_string_length._0_4_ = y + 1;
          bVar4 = true;
          dVar12 = (deUint32)local_6e0._M_string_length;
          local_6e0._M_dataplus._M_p._0_4_ = y;
          local_6e0._M_dataplus._M_p._4_4_ = z;
          local_6e0._M_string_length._4_4_ = dVar6;
        }
      }
      else {
        dVar12 = y + 1;
      }
    }
  }
  if (bVar4) {
    local_650.m_data[1] = local_6e0._M_dataplus._M_p._4_4_;
    local_650.m_data[0] = (deUint32)local_6e0._M_dataplus._M_p;
    properties.driverVersion = local_6e0._M_string_length._4_4_;
    properties.apiVersion = (deUint32)local_6e0._M_string_length;
    tcu::operator-((Vector<int,_2> *)&properties,&local_650);
    if (pointSize.m_data[0] == pointSize.m_data[1]) {
      iVar8 = (int)local_690;
      if (pointSize.m_data[0] == iVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&properties,"OK",(allocator<char> *)&local_6e0);
        pTVar11 = local_698;
        tcu::TestStatus::pass(local_698,(string *)&properties);
        goto LAB_0071bde4;
      }
      pdVar1 = &properties.vendorID;
      properties._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
      std::operator<<((ostream *)pdVar1,"ERROR! Point size invalid, expected ");
      std::ostream::operator<<(pdVar1,iVar8);
      std::operator<<((ostream *)pdVar1,", got ");
      std::ostream::operator<<(pdVar1,pointSize.m_data[0]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      pdVar1 = &properties.vendorID;
      properties._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
      std::operator<<((ostream *)pdVar1,"ERROR! Rasterized point is not a square. Point size was ");
      tcu::operator<<((ostream *)pdVar1,&pointSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    properties._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&properties.vendorID);
    std::operator<<((ostream *)&properties.vendorID,
                    "Verification failed, could not find any point fragments.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&properties.vendorID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&properties,"Didn\'t render expected point",(allocator<char> *)&local_6e0);
  pTVar11 = local_698;
  tcu::TestStatus::fail(local_698,(string *)&properties);
LAB_0071bde4:
  std::__cxx11::string::~string((string *)&properties);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_648);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_138);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_6b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_528);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_508);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_4e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_628);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_4c8);
  tessellation::Buffer::~Buffer(&colorBuffer);
  Image::~Image(&colorAttachmentImage);
  return pTVar11;
}

Assistant:

tcu::TestStatus test (Context& context, const Flags flags)
{
	const int expectedPointSize = getExpectedPointSize(flags);
	{
		const InstanceInterface& vki        = context.getInstanceInterface();
		const VkPhysicalDevice   physDevice = context.getPhysicalDevice();

		requireFeatures           (vki, physDevice, FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_SHADER_TESSELLATION_AND_GEOMETRY_POINT_SIZE);
		checkPointSizeRequirements(vki, physDevice, expectedPointSize);
	}
	{
		tcu::TestLog& log = context.getTestContext().getLog();

		if (flags & FLAG_VERTEX_SET)
			log << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_EVALUATION_SET)
			log << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_ADD)
			log << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_SET)
			log << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_ADD)
			log << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	}

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer

	const VkDeviceSize	colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer          (vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	GraphicsPipelineBuilder			pipelineBuilder;

	pipelineBuilder
		.setPrimitiveTopology		  (VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (1)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL);

	if (isTessellationStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL);

	if (isGeometryStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				context.getBinaryCollection().get("geom"), DE_NULL);

	const Unique<VkPipeline> pipeline(pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);
		tcu::ConstPixelBufferAccess image(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, alloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogImage("color0", "", image);

		if (verifyImage(log, image, expectedPointSize))
			return tcu::TestStatus::pass("OK");
		else
			return tcu::TestStatus::fail("Didn't render expected point");
	}
}